

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3_xauth p_Var1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  sqlite3 *db_00;
  RenameCtx *pRename;
  uchar *zSql;
  uchar *zNew_00;
  uchar *puVar5;
  Parse *in_RDX;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  SrcItem *pItem;
  int i;
  TriggerStep *pStep;
  Trigger *pTrigger;
  FKey *pFKey;
  Select *pSelect;
  Table *pTab;
  int isLegacy;
  sqlite3_xauth xAuth;
  int bQuote;
  int rc;
  int bTemp;
  char *zNew;
  char *zOld;
  char *zInput;
  char *zDb;
  sqlite3 *db;
  NameContext sNC;
  Walker sWalker;
  RenameCtx sCtx;
  Parse sParse;
  undefined4 in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  Parse *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  sqlite3 *in_stack_fffffffffffffd40;
  long lVar6;
  sqlite3 *in_stack_fffffffffffffd48;
  sqlite3_value *in_stack_fffffffffffffd50;
  FKey *pFVar7;
  char *in_stack_fffffffffffffd58;
  Table *in_stack_fffffffffffffd60;
  int local_280;
  Parse *local_238 [7];
  Parse *local_200;
  code *local_1f8;
  code *local_1f0;
  undefined1 *local_1d8;
  undefined1 local_1d0 [16];
  Table *local_1c0;
  char *local_1b8;
  Parse local_1b0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = sqlite3_context_db_handle(in_RDI);
  pRename = (RenameCtx *)sqlite3_value_text((sqlite3_value *)0x227e08);
  zSql = sqlite3_value_text((sqlite3_value *)0x227e1e);
  zNew_00 = sqlite3_value_text((sqlite3_value *)0x227e34);
  puVar5 = sqlite3_value_text((sqlite3_value *)0x227e4a);
  sqlite3_value_int((sqlite3_value *)0x227e60);
  if (((zSql != (uchar *)0x0) && (zNew_00 != (uchar *)0x0)) && (puVar5 != (uchar *)0x0)) {
    memset(&local_1b0,0xaa,0x1a8);
    local_1d0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_1d0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_1c0 = (Table *)&DAT_aaaaaaaaaaaaaaaa;
    local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
    memset(&local_200,0xaa,0x30);
    p_Var1 = db_00->xAuth;
    db_00->xAuth = (sqlite3_xauth)0x0;
    sqlite3BtreeEnterAll((sqlite3 *)0x227f36);
    memset(local_1d0,0,0x20);
    local_1c0 = sqlite3FindTable(in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,
                                 (char *)CONCAT44(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38));
    memset(&local_200,0,0x30);
    local_200 = &local_1b0;
    local_1f8 = renameTableExprCb;
    local_1f0 = renameTableSelectCb;
    local_1d8 = local_1d0;
    local_280 = renameParseSql((Parse *)in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,
                               (sqlite3 *)
                               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                               (char *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
    iVar4 = (int)((ulong)puVar5 >> 0x20);
    if (local_280 == 0) {
      uVar2 = db_00->flags;
      if (local_1b0.pNewTable == (Table *)0x0) {
        if (local_1b0.pNewIndex == (Index *)0x0) {
          in_stack_fffffffffffffd40 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
          in_stack_fffffffffffffd48 = (sqlite3 *)local_1b0.pNewTrigger;
          iVar4 = sqlite3_stricmp((char *)CONCAT44(in_stack_fffffffffffffd2c,
                                                   in_stack_fffffffffffffd28),(char *)0x22826c);
          if ((iVar4 == 0) && (local_1c0->pSchema == (Schema *)in_stack_fffffffffffffd48->flags)) {
            renameTokenFind(&local_1b0,(RenameCtx *)local_1d0,(Vdbe *)(local_1b0.pNewTrigger)->table
                           );
          }
          iVar4 = (int)((ulong)puVar5 >> 0x20);
          if ((uVar2 & 0x4000000) == 0) {
            local_280 = renameResolveTrigger(in_RDX);
            iVar4 = (int)((ulong)puVar5 >> 0x20);
            if (local_280 == 0) {
              renameWalkTrigger((Walker *)in_stack_fffffffffffffd50,
                                (Trigger *)in_stack_fffffffffffffd48);
              for (lVar6 = in_stack_fffffffffffffd48->lastRowid;
                  iVar4 = (int)((ulong)puVar5 >> 0x20), lVar6 != 0; lVar6 = *(long *)(lVar6 + 0x50))
              {
                if ((*(long *)(lVar6 + 0x18) != 0) &&
                   (iVar4 = sqlite3_stricmp((char *)CONCAT44(in_stack_fffffffffffffd2c,
                                                             in_stack_fffffffffffffd28),
                                            (char *)0x22831e), iVar4 == 0)) {
                  renameTokenFind(&local_1b0,(RenameCtx *)local_1d0,*(void **)(lVar6 + 0x18));
                }
                if (*(long *)(lVar6 + 0x20) != 0) {
                  for (in_stack_fffffffffffffd3c = 0;
                      in_stack_fffffffffffffd3c < **(int **)(lVar6 + 0x20);
                      in_stack_fffffffffffffd3c = in_stack_fffffffffffffd3c + 1) {
                    in_stack_fffffffffffffd30 =
                         (Parse *)(*(long *)(lVar6 + 0x20) + 8 +
                                  (long)in_stack_fffffffffffffd3c * 0x48);
                    iVar4 = sqlite3_stricmp((char *)CONCAT44(in_stack_fffffffffffffd2c,
                                                             in_stack_fffffffffffffd28),
                                            (char *)0x2283a5);
                    if (iVar4 == 0) {
                      renameTokenFind(&local_1b0,(RenameCtx *)local_1d0,
                                      in_stack_fffffffffffffd30->db);
                    }
                  }
                }
              }
              in_stack_fffffffffffffd40 = (sqlite3 *)0x0;
            }
          }
        }
        else {
          renameTokenFind(&local_1b0,(RenameCtx *)local_1d0,(local_1b0.pNewIndex)->zName);
          if ((uVar2 & 0x4000000) == 0) {
            sqlite3WalkExpr((Walker *)in_stack_fffffffffffffd30,
                            (Expr *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
          }
        }
      }
      else {
        in_stack_fffffffffffffd60 = local_1b0.pNewTable;
        if ((local_1b0.pNewTable)->eTabType == '\x02') {
          if ((uVar2 & 0x4000000) == 0) {
            in_stack_fffffffffffffd58 = *(char **)&(local_1b0.pNewTable)->u;
            memset(local_238,0xaa,0x38);
            memset(local_238,0,0x38);
            local_238[0] = &local_1b0;
            *(uint *)(in_stack_fffffffffffffd58 + 4) =
                 *(uint *)(in_stack_fffffffffffffd58 + 4) & 0xffdfffff;
            sqlite3SelectPrep(in_stack_fffffffffffffd30,
                              (Select *)
                              CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                              (NameContext *)0x2280b5);
            if (local_1b0.nErr == 0) {
              sqlite3WalkSelect((Walker *)
                                CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                (Select *)in_stack_fffffffffffffd30);
              in_stack_fffffffffffffd60 = local_1b0.pNewTable;
            }
            else {
              local_280 = local_1b0.rc;
              in_stack_fffffffffffffd60 = local_1b0.pNewTable;
            }
          }
        }
        else {
          if ((((uVar2 & 0x4000000) == 0) || ((db_00->flags & 0x4000) != 0)) &&
             ((local_1b0.pNewTable)->eTabType != '\x01')) {
            for (pFVar7 = ((local_1b0.pNewTable)->u).tab.pFKey; iVar4 = (int)((ulong)puVar5 >> 0x20)
                , pFVar7 != (FKey *)0x0; pFVar7 = pFVar7->pNextFrom) {
              iVar4 = sqlite3_stricmp((char *)CONCAT44(in_stack_fffffffffffffd2c,
                                                       in_stack_fffffffffffffd28),(char *)0x22814e);
              if (iVar4 == 0) {
                renameTokenFind(&local_1b0,(RenameCtx *)local_1d0,pFVar7->zTo);
              }
            }
            in_stack_fffffffffffffd50 = (sqlite3_value *)0x0;
          }
          iVar3 = sqlite3_stricmp((char *)CONCAT44(in_stack_fffffffffffffd2c,
                                                   in_stack_fffffffffffffd28),(char *)0x228197);
          if (iVar3 == 0) {
            local_1c0 = in_stack_fffffffffffffd60;
            if ((uVar2 & 0x4000000) == 0) {
              sqlite3WalkExprList((Walker *)
                                  CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                  (ExprList *)in_stack_fffffffffffffd30);
            }
            renameTokenFind(&local_1b0,(RenameCtx *)local_1d0,in_stack_fffffffffffffd60->zName);
          }
        }
      }
    }
    if (local_280 == 0) {
      local_280 = renameEditSql((sqlite3_context *)db_00,pRename,(char *)zSql,(char *)zNew_00,iVar4)
      ;
    }
    if (local_280 != 0) {
      if ((local_280 == 1) && (iVar4 = sqlite3WritableSchema(db_00), iVar4 != 0)) {
        sqlite3_result_value
                  ((sqlite3_context *)in_stack_fffffffffffffd30,
                   (sqlite3_value *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      }
      else if (local_1b0.zErrMsg == (char *)0x0) {
        sqlite3_result_error_code
                  ((sqlite3_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
      }
      else {
        renameColumnParseError
                  ((sqlite3_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                   in_stack_fffffffffffffd50,(sqlite3_value *)in_stack_fffffffffffffd48,
                   (Parse *)in_stack_fffffffffffffd40);
      }
    }
    renameParseCleanup(in_stack_fffffffffffffd30);
    renameTokenFree(in_stack_fffffffffffffd40,
                    (RenameToken *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    sqlite3BtreeLeaveAll((sqlite3 *)0x2284ed);
    db_00->xAuth = p_Var1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( IsView(pTab) ){
          if( isLegacy==0 ){
            Select *pSelect = pTab->u.view.pSelect;
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            assert( pSelect->selFlags & SF_View );
            pSelect->selFlags &= ~SF_View;
            sqlite3SelectPrep(&sParse, pTab->u.view.pSelect, &sNC);
            if( sParse.nErr ){
              rc = sParse.rc;
            }else{
              sqlite3WalkSelect(&sWalker, pTab->u.view.pSelect);
            }
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( (isLegacy==0 || (db->flags & SQLITE_ForeignKeys))
           && !IsVirtual(pTab)
          ){
            FKey *pFKey;
            assert( IsOrdinaryTable(pTab) );
            for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld)
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
              if( pStep->pFrom ){
                int i;
                for(i=0; i<pStep->pFrom->nSrc; i++){
                  SrcItem *pItem = &pStep->pFrom->a[i];
                  if( 0==sqlite3_stricmp(pItem->zName, zOld) ){
                    renameTokenFind(&sParse, &sCtx, pItem->zName);
                  }
                }
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_ERROR && sqlite3WritableSchema(db) ){
        sqlite3_result_value(context, argv[3]);
      }else if( sParse.zErrMsg ){
        renameColumnParseError(context, "", argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}